

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserManager.hpp
# Opt level: O2

void __thiscall sjtu::UserManager::login(UserManager *this,int argc,string *argv)

{
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *this_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ostream *poVar3;
  string *psVar4;
  long lVar5;
  pair<long,_bool> pVar6;
  long local_a8;
  undefined1 local_a0;
  string uspass;
  string usname;
  string local_58;
  hashType local_38;
  
  usname._M_dataplus._M_p = (pointer)&usname.field_2;
  usname._M_string_length = 0;
  uspass._M_dataplus._M_p = (pointer)&uspass.field_2;
  uspass._M_string_length = 0;
  lVar5 = 0;
  usname.field_2._M_local_buf[0] = '\0';
  uspass.field_2._M_local_buf[0] = '\0';
  do {
    if (argc <= lVar5) {
      this_00 = this->UserBpTree;
      std::__cxx11::string::string((string *)&local_58,(string *)&usname);
      local_38 = StringHasher::operator()((StringHasher *)this,&local_58);
      pVar6 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                        (this_00,&local_38);
      local_a8 = pVar6.first;
      local_a0 = pVar6.second;
      std::__cxx11::string::~string((string *)&local_58);
      if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,-1);
        std::endl<char,std::char_traits<char>>(poVar3);
      }
      else {
        iVar2 = (*(this->UserFile->super_FileManager_Base<sjtu::userType>)._vptr_FileManager_Base[2]
                )(this->UserFile,&local_a8);
        lVar5 = CONCAT44(extraout_var,iVar2);
        bVar1 = std::operator==(&uspass,(char *)(lVar5 + 0x15));
        iVar2 = -1;
        if ((bVar1) && (*(uint *)(lVar5 + 0x6c) != this->online_flag)) {
          *(uint *)(lVar5 + 0x6c) = this->online_flag;
          iVar2 = 0;
          (*(this->UserFile->super_FileManager_Base<sjtu::userType>)._vptr_FileManager_Base[3])
                    (this->UserFile,lVar5 + 0x78);
        }
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
        std::endl<char,std::char_traits<char>>(poVar3);
      }
      std::__cxx11::string::~string((string *)&uspass);
      std::__cxx11::string::~string((string *)&usname);
      return;
    }
    bVar1 = std::operator==(argv,"-u");
    psVar4 = &usname;
    if (bVar1) {
LAB_00104185:
      std::__cxx11::string::_M_assign((string *)psVar4);
    }
    else {
      bVar1 = std::operator==(argv,"-p");
      psVar4 = &uspass;
      if (bVar1) goto LAB_00104185;
    }
    lVar5 = lVar5 + 2;
    argv = argv + 2;
  } while( true );
}

Assistant:

void login(int argc, std::string *argv) {
            std::string usname, uspass;
            for (int i = 0; i < argc; i += 2) {
                if (argv[i] == "-u") usname = argv[i + 1];
                else if (argv[i] == "-p") uspass = argv[i + 1];
            }
            std::pair<locType, bool> tmp = UserBpTree->find(hasher(usname));
            if (tmp.second == true) {
                userType *user = UserFile->read(tmp.first);
                if (uspass == user->password && user->is_online != online_flag) {
                    user->is_online = online_flag;
                    UserFile->save(user->offset);
                    std::cout << 0 << std::endl;
                } else std::cout << -1 << std::endl;
            } else std::cout << -1 << std::endl;
        }